

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btIndexedMesh>::push_back
          (btAlignedObjectArray<btIndexedMesh> *this,btIndexedMesh *_Val)

{
  btIndexedMesh *pbVar1;
  uchar *puVar2;
  uchar *puVar3;
  undefined8 uVar4;
  btIndexedMesh *pbVar5;
  PHY_ScalarType PVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  
  iVar10 = this->m_size;
  if (iVar10 == this->m_capacity) {
    iVar11 = 1;
    if (iVar10 != 0) {
      iVar11 = iVar10 * 2;
    }
    reserve(this,iVar11);
    iVar10 = this->m_size;
  }
  pbVar1 = this->m_data;
  iVar8 = _Val->m_numTriangles;
  uVar9 = *(undefined4 *)&_Val->field_0x4;
  puVar2 = _Val->m_triangleIndexBase;
  iVar11 = _Val->m_triangleIndexStride;
  iVar7 = _Val->m_numVertices;
  puVar3 = _Val->m_vertexBase;
  PVar6 = _Val->m_indexType;
  uVar4 = *(undefined8 *)&_Val->m_vertexType;
  pbVar5 = pbVar1 + iVar10;
  pbVar5->m_vertexStride = _Val->m_vertexStride;
  pbVar5->m_indexType = PVar6;
  *(undefined8 *)(&pbVar5->m_vertexStride + 2) = uVar4;
  pbVar5 = pbVar1 + iVar10;
  pbVar5->m_triangleIndexStride = iVar11;
  pbVar5->m_numVertices = iVar7;
  *(uchar **)(&pbVar5->m_triangleIndexStride + 2) = puVar3;
  pbVar1 = pbVar1 + iVar10;
  pbVar1->m_numTriangles = iVar8;
  *(undefined4 *)&pbVar1->field_0x4 = uVar9;
  pbVar1->m_triangleIndexBase = puVar2;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}